

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  char *buf;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  long lVar8;
  ulong uVar9;
  char *__s;
  char *pcVar10;
  bool bVar11;
  char remain [4];
  char client_id [13];
  byte local_5c [4];
  undefined1 local_58 [5];
  undefined3 uStack_53;
  undefined4 uStack_50;
  undefined1 uStack_4c;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  *done = false;
  local_5c[0] = 0;
  local_5c[1] = 0;
  local_5c[2] = 0;
  local_5c[3] = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_58 = (undefined1  [5])0x6c727563;
  uStack_53 = 0;
  pcVar10 = (data->state).aptr.user;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  local_38 = strlen(pcVar10);
  __s = (data->state).aptr.passwd;
  if (__s == (char *)0x0) {
    __s = "";
  }
  local_40 = strlen(__s);
  lVar8 = local_40 + local_38 + (ulong)(local_38 != 0) * 2;
  bVar11 = local_40 != 0;
  uVar9 = 0;
  uVar6 = lVar8 + (ulong)bVar11 * 2 + 0x18;
  uVar7 = uVar9;
  if (uVar6 != 0) {
    do {
      local_58[uVar7 - 4] = (0x7f < uVar6) << 7 | (byte)uVar6 & 0x7f;
      uVar9 = uVar7 + 1;
      if (2 < uVar7) break;
      bVar3 = 0x7f < uVar6;
      uVar6 = uVar6 >> 7;
      uVar7 = uVar9;
    } while (bVar3);
  }
  __n = (size_t)(int)uVar9;
  uVar9 = lVar8 + (ulong)bVar11 * 2 + __n + 0x19;
  CVar4 = CURLE_WEIRD_SERVER_REPLY;
  if (0xfffffff < uVar9) goto LAB_001437a9;
  buf = (char *)(*Curl_cmalloc)(uVar9);
  if (buf == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
    goto LAB_001437a9;
  }
  local_48 = uVar9;
  memset(buf,0,uVar9);
  *buf = '\x10';
  memcpy(buf + 1,local_5c,__n);
  pcVar1 = buf + __n + 1;
  pcVar1[0] = '\0';
  pcVar1[1] = '\x04';
  pcVar1[2] = 'M';
  pcVar1[3] = 'Q';
  pcVar1[4] = 'T';
  pcVar1[5] = 'T';
  pcVar1[6] = '\x04';
  pcVar1[7] = '\x02';
  (buf + __n + 9)[0] = '\0';
  (buf + __n + 9)[1] = '<';
  CVar4 = Curl_rand_alnum(data,local_58 + 4,9);
  sVar5 = strlen(local_58);
  if (sVar5 == 0xc) {
    (buf + __n + 0xb)[0] = '\0';
    (buf + __n + 0xb)[1] = '\f';
    *(ulong *)(buf + __n + 0xd) = CONCAT35(uStack_53,local_58);
    *(undefined4 *)(buf + __n + 0x15) = uStack_50;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",local_58);
    }
    lVar8 = local_38 + __n + 0x19;
    if (local_38 == 0) {
LAB_00143705:
      if (local_40 != 0) {
        if (0xffff < local_40) {
          pcVar10 = "Password is too large: [%zu]";
          goto LAB_00143766;
        }
        buf[__n + 8] = buf[__n + 8] | 0x40;
        buf[lVar8] = (char)(local_40 >> 8);
        buf[lVar8 + 1] = (char)local_40;
        memcpy(buf + lVar8 + 2,__s,local_40);
      }
      if (CVar4 == CURLE_OK) {
        CVar4 = mqtt_send(data,buf,local_48);
      }
    }
    else {
      if (local_38 < 0x10000) {
        buf[__n + 8] = buf[__n + 8] | 0x80;
        lVar8 = local_38 + __n + 0x1b;
        buf[__n + 0x19] = (char)(local_38 >> 8);
        buf[__n + 0x1a] = (char)local_38;
        memcpy(buf + __n + 0x1b,pcVar10,local_38);
        goto LAB_00143705;
      }
      pcVar10 = "Username is too large: [%zu]";
LAB_00143766:
      Curl_failf(data,pcVar10);
      CVar4 = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar5);
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  (*Curl_cfree)(buf);
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
LAB_001437a9:
  if (CVar4 == CURLE_OK) {
    (data->conn->proto).ftpc.pp.nread_resp = 0x200000000;
    CVar4 = CURLE_OK;
  }
  else {
    Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)CVar4);
  }
  return CVar4;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}